

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall cmComputeLinkInformation::AddItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  size_type *psVar1;
  string *config;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  TargetType TVar6;
  int iVar7;
  size_t sVar8;
  const_iterator cVar9;
  cmXcFrameworkPlistLibrary *pcVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 uVar11;
  cmGeneratorTarget *this_00;
  pointer pcVar12;
  cmListFileBacktrace *bt;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view str;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  cmGeneratorTarget *tgt;
  string exe;
  string xcFrameworkPath;
  LinkEntry libEntry;
  cmGeneratorTarget *local_230;
  undefined1 local_228 [56];
  bool local_1f0;
  undefined1 local_1e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  element_type *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  size_type local_198;
  pointer local_190;
  undefined8 local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  undefined1 *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  pointer local_160;
  undefined8 local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  _Base_ptr local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  key_type local_110;
  string local_d8;
  string local_b8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_98;
  FeatureDescriptor *local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  this_00 = entry->Target;
  local_230 = this_00;
  if (this_00 != (cmGeneratorTarget *)0x0) {
    config = &this->Config;
    bVar4 = cmGeneratorTarget::IsExecutableWithExports(this_00);
    if (((bVar4) && (bVar5 = cmGeneratorTarget::HasImportLibrary(this_00,config), !bVar5)) &&
       ((this->LoaderFlag).Value == (string *)0x0)) {
      return;
    }
    bVar5 = cmGeneratorTarget::IsLinkable(this_00);
    if (bVar5) {
      if (bVar4 && (this->LoaderFlag).Value != (string *)0x0) {
        bVar4 = cmGeneratorTarget::HasImportLibrary(this_00,config);
        cmGeneratorTarget::GetFullPath((string *)local_228,this_00,config,(uint)bVar4,true);
        local_130 = &local_120;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_228._0_8_,(pointer)(local_228._8_8_ + local_228._0_8_)
                  );
        local_1a8 = (entry->Item).Backtrace.
                    super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        local_1a0 = (entry->Item).Backtrace.
                    super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
        if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_1a0->_M_use_count = local_1a0->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_1a0->_M_use_count = local_1a0->_M_use_count + 1;
          }
        }
        local_1c8._M_allocated_capacity = (size_type)&local_1b8;
        if (local_130 == &local_120) {
          local_1b8._8_8_ = local_120._8_8_;
        }
        else {
          local_1c8._M_allocated_capacity = (size_type)local_130;
        }
        local_1b8._M_allocated_capacity._1_7_ = local_120._M_allocated_capacity._1_7_;
        local_1b8._M_local_buf[0] = local_120._M_local_buf[0];
        local_1c8._8_8_ = local_128;
        local_128 = (_Base_ptr)0x0;
        local_120._M_local_buf[0] = '\0';
        local_d8._M_dataplus._M_p._0_4_ = 1;
        local_68 = (FeatureDescriptor *)0x0;
        sVar8 = (entry->Feature)._M_string_length;
        if (sVar8 == (anonymous_namespace)::DEFAULT_abi_cxx11_[1]) {
          local_130 = &local_120;
          if (sVar8 != 0) {
            pcVar12 = (entry->Feature)._M_dataplus._M_p;
            iVar7 = bcmp(pcVar12,(void *)*(anonymous_namespace)::DEFAULT_abi_cxx11_,sVar8);
            if (iVar7 != 0) goto LAB_00551517;
          }
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_110,"__CMAKE_LINK_EXECUTABLE","");
        }
        else {
          pcVar12 = (entry->Feature)._M_dataplus._M_p;
          local_130 = &local_120;
LAB_00551517:
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char*>((string *)&local_110,pcVar12,pcVar12 + sVar8);
        }
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
                ::find(&(this->LibraryFeatureDescriptors)._M_t,&local_110);
        local_1e8._0_8_ = (FeatureDescriptor *)0x0;
        if ((_Rb_tree_header *)cVar9._M_node !=
            &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
          local_1e8._0_8_ = (FeatureDescriptor *)(cVar9._M_node + 2);
        }
        std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
        emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
                  ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                    *)this,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_1c8,(ItemIsPath *)&local_d8,&local_230,&local_68,
                   (FeatureDescriptor **)local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,
                          (ulong)(local_110.field_2._M_allocated_capacity + 1));
        }
        if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_allocated_capacity != &local_1b8) {
          operator_delete((void *)local_1c8._M_allocated_capacity,
                          local_1b8._M_allocated_capacity + 1);
        }
        if (local_130 != &local_120) {
          operator_delete(local_130,
                          CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0])
                          + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->Depends,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
LAB_0055160b:
        uVar11 = local_228._0_8_;
        if ((undefined1 *)local_228._0_8_ == local_228 + 0x10) goto LAB_00551626;
      }
      else {
        TVar6 = cmGeneratorTarget::GetType(this_00);
        if (TVar6 == INTERFACE_LIBRARY) {
          local_1c8._8_8_ = (_Base_ptr)0x0;
          local_1b8._M_allocated_capacity = local_1b8._M_allocated_capacity & 0xffffffffffffff00;
          local_228._0_8_ = local_228._0_8_ & 0xffffffff00000000;
          local_1c8._M_allocated_capacity = (size_type)&local_1b8;
          std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
          ::
          emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&>
                    ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                      *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1c8,(ItemIsPath *)local_228,&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_allocated_capacity != &local_1b8) {
            operator_delete((void *)local_1c8._M_allocated_capacity,
                            local_1b8._M_allocated_capacity + 1);
          }
          cmGeneratorTarget::GetImportedLibName((string *)local_228,local_230,config);
          if (local_228._8_8_ != 0) {
            local_150 = &local_140;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_150,local_228._0_8_,
                       (pointer)(local_228._8_8_ + local_228._0_8_));
            local_98.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (entry->Item).Backtrace.
                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            local_98.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi =
                 (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
            if (local_98.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_98.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_98.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                      TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_98.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_98.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                      TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            paVar2 = &local_98.Value.field_2;
            if (local_150 == &local_140) {
              local_98.Value.field_2._8_8_ = local_140._8_8_;
              local_98.Value._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_98.Value._M_dataplus._M_p = (pointer)local_150;
            }
            local_98.Value.field_2._M_allocated_capacity._1_7_ =
                 local_140._M_allocated_capacity._1_7_;
            local_98.Value.field_2._M_local_buf[0] = local_140._M_local_buf[0];
            local_98.Value._M_string_length = local_148;
            local_148 = 0;
            local_140._M_local_buf[0] = '\0';
            local_150 = &local_140;
            cmComputeLinkDepends::LinkEntry::LinkEntry
                      ((LinkEntry *)&local_1c8,&local_98,(cmGeneratorTarget *)0x0);
            AddItem(this,(LinkEntry *)&local_1c8);
            if (local_180 != &local_170) {
              operator_delete(local_180,local_170._M_allocated_capacity + 1);
            }
            if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_allocated_capacity != &local_1b8) {
              operator_delete((void *)local_1c8._M_allocated_capacity,
                              local_1b8._M_allocated_capacity + 1);
            }
            if (local_98.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_98.Backtrace.
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98.Value._M_dataplus._M_p != paVar2) {
              operator_delete(local_98.Value._M_dataplus._M_p,
                              local_98.Value.field_2._M_allocated_capacity + 1);
            }
            if (local_150 != &local_140) {
              operator_delete(local_150,
                              CONCAT71(local_140._M_allocated_capacity._1_7_,
                                       local_140._M_local_buf[0]) + 1);
            }
          }
          goto LAB_0055160b;
        }
        TVar6 = cmGeneratorTarget::GetType(this_00);
        if (TVar6 == OBJECT_LIBRARY) {
          local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffff00000000;
          std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
          ::
          emplace_back<BT<std::__cxx11::string>const&,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&>
                    ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                      *)this,&entry->Item,(ItemIsPath *)&local_1c8._M_allocated_capacity,&local_230)
          ;
          goto LAB_00551626;
        }
        iVar7 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x29])();
        if ((char)iVar7 == '\0') {
LAB_005517ac:
          bVar4 = cmGeneratorTarget::HasImportLibrary(this_00,config);
          cmGeneratorTarget::GetFullPath(&local_b8,local_230,config,(uint)bVar4,true);
          local_228._32_8_ =
               (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          local_228._40_8_ =
               (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          if ((pointer)local_228._40_8_ != (pointer)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              psVar1 = &(((pointer)local_228._40_8_)->LibraryIdentifier)._M_string_length;
              *(int *)psVar1 = (int)*psVar1 + 1;
              UNLOCK();
            }
            else {
              psVar1 = &(((pointer)local_228._40_8_)->LibraryIdentifier)._M_string_length;
              *(int *)psVar1 = (int)*psVar1 + 1;
            }
          }
          local_228._0_8_ = local_228 + 0x10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
            local_228._24_8_ = local_b8.field_2._8_8_;
          }
          else {
            local_228._0_8_ = local_b8._M_dataplus._M_p;
          }
          local_228._8_8_ = local_b8._M_string_length;
          local_b8._M_string_length = 0;
          local_b8.field_2._M_local_buf[0] = '\0';
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          bVar5 = cmGeneratorTarget::IsAIX(local_230);
          if ((bVar5) &&
             (str._M_str = (char *)local_228._0_8_, str._M_len = local_228._8_8_,
             bVar5 = cmHasLiteralSuffix<10ul>(str,(char (*) [10])0x91564e), bVar4 && bVar5)) {
            BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            ~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_228);
            return;
          }
          if ((this->LinkDependsNoShared != true) ||
             (TVar6 = cmGeneratorTarget::GetType(local_230), TVar6 != SHARED_LIBRARY)) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->Depends,(value_type *)local_228);
          }
          cmComputeLinkDepends::LinkEntry::LinkEntry((LinkEntry *)&local_1c8,entry);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator=((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1c8,
                    (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_228);
          AddTargetItem(this,(LinkEntry *)&local_1c8);
          bVar4 = cmGeneratorTarget::IsApple(local_230);
          if ((bVar4) && (bVar4 = cmGeneratorTarget::HasImportLibrary(local_230,config), bVar4)) {
            cmGeneratorTarget::GetFullPath(&local_110,local_230,config,RuntimeBinaryArtifact,true);
            AddLibraryRuntimeInfo(this,&local_110,local_230);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,
                              (ulong)(local_110.field_2._M_allocated_capacity + 1));
            }
          }
          else {
            AddLibraryRuntimeInfo(this,(string *)local_228,local_230);
          }
          if (((local_230 != (cmGeneratorTarget *)0x0) &&
              (TVar6 = cmGeneratorTarget::GetType(local_230), TVar6 == SHARED_LIBRARY)) &&
             (bVar4 = cmGeneratorTarget::IsDLLPlatform(this->Target), bVar4)) {
            AddRuntimeDLL(this,local_230);
          }
          cmComputeLinkDepends::LinkEntry::~LinkEntry((LinkEntry *)&local_1c8);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                    ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_228);
          goto LAB_00551626;
        }
        cmGeneratorTarget::GetImportedXcFrameworkPath((string *)&local_1c8,this_00,config);
        uVar11 = local_1c8._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_allocated_capacity != &local_1b8) {
          operator_delete((void *)local_1c8._M_allocated_capacity,
                          local_1b8._M_allocated_capacity + 1);
        }
        this_00 = local_230;
        if ((_Base_ptr)uVar11 == (_Base_ptr)0x0) goto LAB_005517ac;
        cmGeneratorTarget::GetImportedXcFrameworkPath((string *)&local_1c8,local_230,config);
        local_1e8._0_4_ = 1;
        local_110._M_dataplus._M_p = (pointer)0x0;
        sVar8 = (entry->Feature)._M_string_length;
        if (sVar8 == (anonymous_namespace)::DEFAULT_abi_cxx11_[1]) {
          if (sVar8 != 0) {
            pcVar12 = (entry->Feature)._M_dataplus._M_p;
            iVar7 = bcmp(pcVar12,(void *)*(anonymous_namespace)::DEFAULT_abi_cxx11_,sVar8);
            if (iVar7 != 0) goto LAB_00551af9;
          }
          local_228._0_8_ = local_228 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_228,"__CMAKE_LINK_XCFRAMEWORK","");
        }
        else {
          pcVar12 = (entry->Feature)._M_dataplus._M_p;
LAB_00551af9:
          local_228._0_8_ = local_228 + 0x10;
          std::__cxx11::string::_M_construct<char*>((string *)local_228,pcVar12,pcVar12 + sVar8);
        }
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
                ::find(&(this->LibraryFeatureDescriptors)._M_t,(key_type *)local_228);
        local_68 = (FeatureDescriptor *)0x0;
        if ((_Rb_tree_header *)cVar9._M_node !=
            &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
          local_68 = (FeatureDescriptor *)(cVar9._M_node + 2);
        }
        std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
        emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
                  ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                    *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1c8,(ItemIsPath *)local_1e8,&local_230,(void **)&local_110,
                   &local_68);
        if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
          operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
        }
        local_228._16_8_ = local_1b8._M_allocated_capacity;
        uVar11 = local_1c8._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_allocated_capacity == &local_1b8) goto LAB_00551626;
      }
      operator_delete((void *)uVar11,local_228._16_8_ + 1);
LAB_00551626:
      cmGeneratorTarget::GetImportedXcFrameworkPath((string *)local_1e8,local_230,config);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bt = &(entry->Item).Backtrace;
        cmParseXcFrameworkPlist
                  ((optional<cmXcFrameworkPlist> *)local_228,(string *)local_1e8,this->Makefile,bt);
        if (local_1f0 != false) {
          pcVar10 = cmXcFrameworkPlist::SelectSuitableLibrary
                              ((cmXcFrameworkPlist *)local_228,this->Makefile,bt);
          if ((pcVar10 != (cmXcFrameworkPlistLibrary *)0x0) &&
             (sVar3 = (pcVar10->HeadersPath)._M_string_length, sVar3 != 0)) {
            local_1c8._M_allocated_capacity = local_1e8._8_8_;
            local_1c8._8_8_ = local_1e8._0_8_;
            local_1b8._M_allocated_capacity = 0;
            local_1a8 = (element_type *)((long)local_110.field_2._M_local_buf + 8);
            local_110._M_dataplus._M_p = (pointer)0x0;
            local_110._M_string_length = 1;
            local_110.field_2._M_local_buf[8] = '/';
            local_1b8._8_8_ = 1;
            local_1a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_190 = (pcVar10->LibraryIdentifier)._M_dataplus._M_p;
            local_198 = (pcVar10->LibraryIdentifier)._M_string_length;
            local_188 = 0;
            local_178 = local_50;
            local_68 = (FeatureDescriptor *)0x0;
            local_60 = 1;
            local_50[0] = 0x2f;
            local_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x1;
            local_170._M_allocated_capacity = 0;
            local_160 = (pcVar10->HeadersPath)._M_dataplus._M_p;
            local_158 = 0;
            views._M_len = 5;
            views._M_array = (iterator)&local_1c8;
            local_170._8_8_ = sVar3;
            local_110.field_2._M_allocated_capacity = (size_type)local_1a8;
            local_58 = local_178;
            cmCatViews(&local_d8,views);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->XcFrameworkHeaderPaths,&local_d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_d8._M_dataplus._M_p._4_4_,local_d8._M_dataplus._M_p._0_4_) !=
                &local_d8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_d8._M_dataplus._M_p._4_4_,
                                       local_d8._M_dataplus._M_p._0_4_),
                              local_d8.field_2._M_allocated_capacity + 1);
            }
          }
          if (local_1f0 == true) {
            std::_Optional_payload_base<cmXcFrameworkPlist>::_M_destroy
                      ((_Optional_payload_base<cmXcFrameworkPlist> *)local_228);
          }
        }
      }
      if ((FeatureDescriptor *)local_1e8._0_8_ == (FeatureDescriptor *)(local_1e8 + 0x10)) {
        return;
      }
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
      return;
    }
  }
  local_1c8._8_8_ = (entry->Feature)._M_dataplus._M_p;
  sVar8 = (entry->Feature)._M_string_length;
  local_1c8._M_allocated_capacity = sVar8;
  if (8 < sVar8) {
    __str._M_str = "FRAMEWORK";
    __str._M_len = 9;
    iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)&local_1c8,sVar8 - 9,9,
                       __str);
    if (iVar7 == 0) goto LAB_0055114e;
    sVar8 = (entry->Feature)._M_string_length;
  }
  if (sVar8 == (anonymous_namespace)::DEFAULT_abi_cxx11_[1]) {
    if (((sVar8 == 0) ||
        (iVar7 = bcmp((entry->Feature)._M_dataplus._M_p,
                      (void *)*(anonymous_namespace)::DEFAULT_abi_cxx11_,sVar8), iVar7 == 0)) &&
       ((bVar4 = cmSystemTools::IsPathToFramework((string *)entry), bVar4 &&
        (bVar4 = cmGeneratorTarget::IsApple(this->Target), bVar4)))) {
LAB_0055114e:
      AddFrameworkItem(this,entry);
      return;
    }
    sVar8 = (entry->Feature)._M_string_length;
  }
  local_1c8._8_8_ = (entry->Feature)._M_dataplus._M_p;
  local_1c8._M_allocated_capacity = sVar8;
  if (10 < sVar8) {
    __str_00._M_str = "XCFRAMEWORK";
    __str_00._M_len = 0xb;
    iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)&local_1c8,sVar8 - 0xb,
                       0xb,__str_00);
    if (iVar7 == 0) goto LAB_005511e1;
    sVar8 = (entry->Feature)._M_string_length;
  }
  if ((sVar8 != (anonymous_namespace)::DEFAULT_abi_cxx11_[1]) ||
     ((((sVar8 != 0 &&
        (iVar7 = bcmp((entry->Feature)._M_dataplus._M_p,
                      (void *)*(anonymous_namespace)::DEFAULT_abi_cxx11_,sVar8), iVar7 != 0)) ||
       (bVar4 = cmSystemTools::IsPathToXcFramework((string *)entry), !bVar4)) ||
      (bVar4 = cmGeneratorTarget::IsApple(this->Target), !bVar4)))) {
    bVar4 = cmsys::SystemTools::FileIsFullPath((string *)entry);
    if (!bVar4) {
      if (entry->Kind == Object) {
        return;
      }
      AddUserItem(this,entry,true);
      return;
    }
    bVar4 = cmsys::SystemTools::FileIsDirectory((string *)entry);
    if (bVar4) {
      DropDirectoryItem(this,&entry->Item);
      return;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Depends,(value_type *)entry);
    AddFullItem(this,entry);
    AddLibraryRuntimeInfo(this,(string *)entry);
    return;
  }
LAB_005511e1:
  AddXcFrameworkItem(this,entry);
  return;
}

Assistant:

void cmComputeLinkInformation::AddItem(LinkEntry const& entry)
{
  cmGeneratorTarget const* tgt = entry.Target;
  BT<std::string> const& item = entry.Item;

  // Compute the proper name to use to link this library.
  const std::string& config = this->Config;
  bool impexe = (tgt && tgt->IsExecutableWithExports());
  if (impexe && !tgt->HasImportLibrary(config) && !this->LoaderFlag) {
    // Skip linking to executables on platforms with no import
    // libraries or loader flags.
    return;
  }

  if (tgt && tgt->IsLinkable()) {
    // This is a CMake target.  Ask the target for its real name.
    if (impexe && this->LoaderFlag) {
      // This link item is an executable that may provide symbols
      // used by this target.  A special flag is needed on this
      // platform.  Add it now using a special feature.
      cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(config)
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;
      std::string exe = tgt->GetFullPath(config, artifact, true);
      this->Items.emplace_back(
        BT<std::string>(exe, item.Backtrace), ItemIsPath::Yes, tgt, nullptr,
        this->FindLibraryFeature(entry.Feature == DEFAULT
                                   ? "__CMAKE_LINK_EXECUTABLE"
                                   : entry.Feature));
      this->Depends.push_back(std::move(exe));
    } else if (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Add the interface library as an item so it can be considered as part
      // of COMPATIBLE_INTERFACE_ enforcement.  The generators will ignore
      // this for the actual link line.
      this->Items.emplace_back(std::string(), ItemIsPath::No, tgt);

      // Also add the item the interface specifies to be used in its place.
      std::string const& libName = tgt->GetImportedLibName(config);
      if (!libName.empty()) {
        this->AddItem(BT<std::string>(libName, item.Backtrace));
      }
    } else if (tgt->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      this->Items.emplace_back(item, ItemIsPath::No, tgt);
    } else if (this->GlobalGenerator->IsXcode() &&
               !tgt->GetImportedXcFrameworkPath(config).empty()) {
      this->Items.emplace_back(
        tgt->GetImportedXcFrameworkPath(config), ItemIsPath::Yes, tgt, nullptr,
        this->FindLibraryFeature(entry.Feature == DEFAULT
                                   ? "__CMAKE_LINK_XCFRAMEWORK"
                                   : entry.Feature));
    } else {
      // Decide whether to use an import library.
      cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(config)
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;

      // Pass the full path to the target file.
      BT<std::string> lib = BT<std::string>(
        tgt->GetFullPath(config, artifact, true), item.Backtrace);
      if (tgt->IsAIX() && cmHasLiteralSuffix(lib.Value, "-NOTFOUND") &&
          artifact == cmStateEnums::ImportLibraryArtifact) {
        // This is an imported executable on AIX that has ENABLE_EXPORTS
        // but not IMPORTED_IMPLIB.  CMake used to produce and accept such
        // imported executables on AIX before we taught it to use linker
        // import files.  For compatibility, simply skip linking to this
        // executable as we did before.  It works with runtime linking.
        return;
      }
      if (!this->LinkDependsNoShared ||
          tgt->GetType() != cmStateEnums::SHARED_LIBRARY) {
        this->Depends.push_back(lib.Value);
      }

      LinkEntry libEntry{ entry };
      libEntry.Item = lib;
      this->AddTargetItem(libEntry);
      if (tgt->IsApple() && tgt->HasImportLibrary(config)) {
        // Use the library rather than the tbd file for runpath computation
        this->AddLibraryRuntimeInfo(
          tgt->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact, true),
          tgt);
      } else {
        this->AddLibraryRuntimeInfo(lib.Value, tgt);
      }
      if (tgt && tgt->GetType() == cmStateEnums::SHARED_LIBRARY &&
          this->Target->IsDLLPlatform()) {
        this->AddRuntimeDLL(tgt);
      }
    }

    auto xcFrameworkPath = tgt->GetImportedXcFrameworkPath(config);
    if (!xcFrameworkPath.empty()) {
      auto plist = cmParseXcFrameworkPlist(xcFrameworkPath, *this->Makefile,
                                           item.Backtrace);
      if (!plist) {
        return;
      }
      if (auto const* library =
            plist->SelectSuitableLibrary(*this->Makefile, item.Backtrace)) {
        if (!library->HeadersPath.empty()) {
          this->AddXcFrameworkHeaderPath(cmStrCat(xcFrameworkPath, '/',
                                                  library->LibraryIdentifier,
                                                  '/', library->HeadersPath));
        }
      } else {
        return;
      }
    }
  } else {
    // This is not a CMake target.  Use the name given.
    if (cmHasSuffix(entry.Feature, "FRAMEWORK"_s) ||
        (entry.Feature == DEFAULT &&
         cmSystemTools::IsPathToFramework(item.Value) &&
         this->Target->IsApple())) {
      // This is a framework.
      this->AddFrameworkItem(entry);
    } else if (cmHasSuffix(entry.Feature, "XCFRAMEWORK"_s) ||
               (entry.Feature == DEFAULT &&
                cmSystemTools::IsPathToXcFramework(item.Value) &&
                this->Target->IsApple())) {
      // This is a framework.
      this->AddXcFrameworkItem(entry);
    } else if (cmSystemTools::FileIsFullPath(item.Value)) {
      if (cmSystemTools::FileIsDirectory(item.Value)) {
        // This is a directory.
        this->DropDirectoryItem(item);
      } else {
        // Use the full path given to the library file.
        this->Depends.push_back(item.Value);
        this->AddFullItem(entry);
        this->AddLibraryRuntimeInfo(item.Value);
      }
    } else if (entry.Kind != cmComputeLinkDepends::LinkEntry::Object) {
      // This is a library or option specified by the user.
      this->AddUserItem(entry, true);
    }
  }
}